

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O3

void hiberlite::access::destroy<hiberlite::ModelExtractor,Person>(ModelExtractor *param_1,Person *c)

{
  pointer pcVar1;
  
  if (c != (Person *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&c->bio);
    pcVar1 = (c->name)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(c->name).field_2) {
      operator_delete(pcVar1);
    }
  }
  operator_delete(c);
  return;
}

Assistant:

static void destroy(A& /*a*/, C* c)
	{
		delete c;
	}